

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

char * printAliasInstrEx(MCInst *MI,SStream *OS,void *info)

{
  cs_detail *pcVar1;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  MCOperand *pMVar7;
  MCRegisterClass *c_00;
  ulong uVar8;
  uint8_t *puVar9;
  int64_t iVar10;
  char *pcVar11;
  MCRegisterInfo *in_RDX;
  SStream *in_RSI;
  MCInst *in_RDI;
  int cr_2;
  int cr_1;
  int cr;
  MCRegisterInfo *MRI;
  int needComma;
  int decCtr;
  int PrintMethodIdx;
  int OpIdx;
  char *c;
  char *AsmOps;
  char *AsmMnem;
  char *tmp;
  char *opCode;
  SStream ss;
  char *in_stack_fffffffffffffd48;
  SStream *in_stack_fffffffffffffd50;
  MCRegisterClass *in_stack_fffffffffffffd58;
  MCInst *in_stack_fffffffffffffd60;
  MCRegisterClass *in_stack_fffffffffffffd68;
  MCInst *in_stack_fffffffffffffd70;
  char *local_250;
  char *local_248;
  char *local_230;
  
  bVar3 = false;
  SStream_Init((SStream *)&stack0xfffffffffffffddc);
  uVar5 = MCInst_getOpcode(in_RDI);
  switch(uVar5) {
  case 0x5e6:
    local_230 = "b%s";
    break;
  case 0x5e7:
    local_230 = "b%sa";
    break;
  case 0x5e8:
    local_230 = "b%sctr";
    break;
  case 0x5e9:
    local_230 = "b%sctrl";
    break;
  case 0x5ea:
    local_230 = "b%sl";
    break;
  case 0x5eb:
    local_230 = "b%sla";
    break;
  case 0x5ec:
    local_230 = "b%slr";
    break;
  case 0x5ed:
    local_230 = "b%slrl";
    break;
  default:
    return (char *)0x0;
  }
  uVar5 = MCInst_getNumOperands(in_RDI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(in_RDI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(in_RDI,0);
      iVar10 = MCOperand_getImm(pMVar7);
      if (-1 < iVar10) {
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 < 2) {
          SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"dnzf");
          bVar3 = true;
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(in_RDI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(in_RDI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(in_RDI,0);
      iVar10 = MCOperand_getImm(pMVar7);
      if (1 < iVar10) {
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 < 4) {
          SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"dzf");
          bVar3 = true;
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(in_RDI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(in_RDI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(in_RDI,0);
      iVar10 = MCOperand_getImm(pMVar7);
      if (3 < iVar10) {
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 < 8) {
          pMVar7 = MCInst_getOperand(in_RDI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            c_00 = MCRegisterInfo_getRegClass(in_RDX,3);
            pMVar7 = MCInst_getOperand(in_RDI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(c_00,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(in_RDI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              uVar5 = getBICRCond(uVar5);
              in_stack_fffffffffffffd70 = (MCInst *)(ulong)uVar5;
              switch(in_stack_fffffffffffffd70) {
              case (MCInst *)0x0:
                SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"ne");
                break;
              case (MCInst *)0x1:
                SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"le");
                break;
              case (MCInst *)0x2:
                SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"ge");
                break;
              case (MCInst *)0x3:
                SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"ns");
              }
              pMVar7 = MCInst_getOperand(in_RDI,0);
              iVar10 = MCOperand_getImm(pMVar7);
              if (iVar10 == 6) {
                SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
              }
              pMVar7 = MCInst_getOperand(in_RDI,0);
              iVar10 = MCOperand_getImm(pMVar7);
              if (iVar10 == 7) {
                SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
              }
              bVar3 = false;
            }
          }
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(in_RDI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(in_RDI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(in_RDI,0);
      iVar10 = MCOperand_getImm(pMVar7);
      if (7 < iVar10) {
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 < 10) {
          SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"dnzt");
          bVar3 = true;
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(in_RDI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(in_RDI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(in_RDI,0);
      iVar10 = MCOperand_getImm(pMVar7);
      if (9 < iVar10) {
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 < 0xc) {
          SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"dzt");
          bVar3 = true;
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(in_RDI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(in_RDI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(in_RDI,0);
      iVar10 = MCOperand_getImm(pMVar7);
      if (0xb < iVar10) {
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 < 0x10) {
          pMVar7 = MCInst_getOperand(in_RDI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            in_stack_fffffffffffffd68 = MCRegisterInfo_getRegClass(in_RDX,3);
            pMVar7 = MCInst_getOperand(in_RDI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(in_stack_fffffffffffffd68,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(in_RDI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              uVar5 = getBICRCond(uVar5);
              in_stack_fffffffffffffd60 = (MCInst *)(ulong)uVar5;
              switch(in_stack_fffffffffffffd60) {
              case (MCInst *)0x0:
                SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"eq");
                break;
              case (MCInst *)0x1:
                SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"gt");
                break;
              case (MCInst *)0x2:
                SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"lt");
                break;
              case (MCInst *)0x3:
                SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"so");
              }
              pMVar7 = MCInst_getOperand(in_RDI,0);
              iVar10 = MCOperand_getImm(pMVar7);
              if (iVar10 == 0xe) {
                SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
              }
              pMVar7 = MCInst_getOperand(in_RDI,0);
              iVar10 = MCOperand_getImm(pMVar7);
              if (iVar10 == 0xf) {
                SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
              }
              bVar3 = false;
            }
          }
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(in_RDI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(in_RDI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(in_RDI,0);
      uVar8 = MCOperand_getImm(pMVar7);
      if ((uVar8 & 0x12) == 0x10) {
        SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"dnz");
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 == 0x18) {
          SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        }
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 == 0x19) {
          SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        }
      }
    }
  }
  uVar5 = MCInst_getNumOperands(in_RDI);
  if (uVar5 == 3) {
    pMVar7 = MCInst_getOperand(in_RDI,0);
    _Var4 = MCOperand_isImm(pMVar7);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(in_RDI,0);
      uVar8 = MCOperand_getImm(pMVar7);
      if ((uVar8 & 0x12) == 0x12) {
        SStream_concat((SStream *)&stack0xfffffffffffffddc,local_230,"dz");
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 == 0x1a) {
          SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        }
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 == 0x1b) {
          SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        }
      }
    }
  }
  bVar2 = false;
  pMVar7 = MCInst_getOperand(in_RDI,1);
  _Var4 = MCOperand_isReg(pMVar7);
  if (_Var4) {
    in_stack_fffffffffffffd58 = MCRegisterInfo_getRegClass(in_RDX,3);
    pMVar7 = MCInst_getOperand(in_RDI,1);
    uVar5 = MCOperand_getReg(pMVar7);
    _Var4 = MCRegisterClass_contains(in_stack_fffffffffffffd58,uVar5);
    if (_Var4) {
      pMVar7 = MCInst_getOperand(in_RDI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      if (_Var4) {
        pMVar7 = MCInst_getOperand(in_RDI,0);
        iVar10 = MCOperand_getImm(pMVar7);
        if (iVar10 < 0x10) {
          pMVar7 = MCInst_getOperand(in_RDI,1);
          uVar5 = MCOperand_getReg(pMVar7);
          iVar6 = getBICR(uVar5);
          if (bVar3) {
            bVar2 = true;
            SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
            if (10 < iVar6) {
              SStream_concat((SStream *)&stack0xfffffffffffffddc,"4*cr%d+",(ulong)(iVar6 - 10));
            }
            pMVar7 = MCInst_getOperand(in_RDI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            uVar5 = getBICRCond(uVar5);
            in_stack_fffffffffffffd50 = (SStream *)(ulong)uVar5;
            switch(in_stack_fffffffffffffd50) {
            case (SStream *)0x0:
              SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
              op_addBC(in_RDI,0x4c);
              break;
            case (SStream *)0x1:
              SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
              op_addBC(in_RDI,0x2c);
              break;
            case (SStream *)0x2:
              SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
              op_addBC(in_RDI,0xc);
              break;
            case (SStream *)0x3:
              SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
              op_addBC(in_RDI,0x8c);
            }
            pMVar7 = MCInst_getOperand(in_RDI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            iVar6 = getBICR(uVar5);
            if ((10 < iVar6) && (in_RDI->csh->detail != CS_OPT_OFF)) {
              puVar9 = in_RDI->flat_insn->detail->groups +
                       (ulong)(in_RDI->flat_insn->detail->field_6).x86.addr_size * 0x18 + 0x1d;
              puVar9[0] = '@';
              puVar9[1] = '\0';
              puVar9[2] = '\0';
              puVar9[3] = '\0';
              puVar9 = in_RDI->flat_insn->detail->groups +
                       (ulong)(in_RDI->flat_insn->detail->field_6).x86.addr_size * 0x18 + 0x25;
              puVar9[0] = '\x04';
              puVar9[1] = '\0';
              puVar9[2] = '\0';
              puVar9[3] = '\0';
              *(int *)(in_RDI->flat_insn->detail->groups +
                      (ulong)(in_RDI->flat_insn->detail->field_6).x86.addr_size * 0x18 + 0x29) =
                   iVar6 + -8;
              *(undefined4 *)
               (in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.addr_size * 0x18 + 0x2d) =
                   *(undefined4 *)(in_RDI->flat_insn->detail->field_6).x86.prefix;
              pcVar1 = in_RDI->flat_insn->detail;
              (pcVar1->field_6).x86.addr_size = (pcVar1->field_6).x86.addr_size + '\x01';
            }
          }
          else {
            bVar2 = 10 < iVar6;
            if (bVar2) {
              SStream_concat((SStream *)&stack0xfffffffffffffddc," cr%d",(ulong)(iVar6 - 10));
              op_addReg(in_RDI,iVar6 - 8);
            }
          }
        }
      }
    }
  }
  pMVar7 = MCInst_getOperand(in_RDI,2);
  _Var4 = MCOperand_isImm(pMVar7);
  if (_Var4) {
    pMVar7 = MCInst_getOperand(in_RDI,2);
    iVar10 = MCOperand_getImm(pMVar7);
    if (iVar10 != 0) {
      if (bVar2) {
        SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      }
      SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    }
  }
  pcVar11 = cs_strdup((char *)in_stack_fffffffffffffd58);
  local_248 = pcVar11;
  do {
    if (*local_248 == '\0') {
LAB_00335a7e:
      SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      if (*local_248 != '\0') {
        SStream_concat0(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        for (local_250 = local_248; *local_250 != '\0'; local_250 = local_250 + 1) {
          if (*local_250 == '$') {
            if (local_250[1] == -1) {
              printCustomAliasOperand
                        (in_stack_fffffffffffffd60,(uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                         (uint)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
              local_250 = local_250 + 3;
            }
            else {
              printOperand(in_stack_fffffffffffffd70,
                           (uint)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                           (SStream *)in_stack_fffffffffffffd60);
              local_250 = local_250 + 1;
            }
          }
          else {
            SStream_concat(in_RSI,"%c",(ulong)(uint)(int)*local_250);
          }
        }
      }
      return pcVar11;
    }
    if ((*local_248 == ' ') || (*local_248 == '\t')) {
      *local_248 = '\0';
      local_248 = local_248 + 1;
      goto LAB_00335a7e;
    }
    local_248 = local_248 + 1;
  } while( true );
}

Assistant:

static char *printAliasInstrEx(MCInst *MI, SStream *OS, void *info)
{
#define GETREGCLASS_CONTAIN(_class, _reg) MCRegisterClass_contains(MCRegisterInfo_getRegClass(MRI, _class), MCOperand_getReg(MCInst_getOperand(MI, _reg)))
	SStream ss;
	const char *opCode;
	char *tmp, *AsmMnem, *AsmOps, *c;
	int OpIdx, PrintMethodIdx;
	int decCtr = false, needComma = false;
	MCRegisterInfo *MRI = (MCRegisterInfo *)info;

	SStream_Init(&ss);
	switch (MCInst_getOpcode(MI)) {
		default: return NULL;
		case PPC_gBC:
				 opCode = "b%s";
				 break;
		case PPC_gBCA:
				 opCode = "b%sa";
				 break;
		case PPC_gBCCTR:
				 opCode = "b%sctr";
				 break;
		case PPC_gBCCTRL:
				 opCode = "b%sctrl";
				 break;
		case PPC_gBCL:
				 opCode = "b%sl";
				 break;
		case PPC_gBCLA:
				 opCode = "b%sla";
				 break;
		case PPC_gBCLR:
				 opCode = "b%slr";
				 break;
		case PPC_gBCLRL:
				 opCode = "b%slrl";
				 break;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 0) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 1)) {
		SStream_concat(&ss, opCode, "dnzf");
		decCtr = true;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 2) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 3)) {
		SStream_concat(&ss, opCode, "dzf");
		decCtr = true;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 4) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 7) &&
			MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
			GETREGCLASS_CONTAIN(PPC_CRBITRCRegClassID, 1)) {
		int cr = getBICRCond(MCOperand_getReg(MCInst_getOperand(MI, 1)));
		switch(cr) {
			case CREQ:
				SStream_concat(&ss, opCode, "ne");
				break;
			case CRGT:
				SStream_concat(&ss, opCode, "le");
				break;
			case CRLT:
				SStream_concat(&ss, opCode, "ge");
				break;
			case CRUN:
				SStream_concat(&ss, opCode, "ns");
				break;
		}

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 6)
			SStream_concat0(&ss, "-");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 7)
			SStream_concat0(&ss, "+");

		decCtr = false;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 8) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 9)) {
		SStream_concat(&ss, opCode, "dnzt");
		decCtr = true;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 10) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 11)) {
		SStream_concat(&ss, opCode, "dzt");
		decCtr = true;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) >= 12) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) <= 15) &&
			MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
			GETREGCLASS_CONTAIN(PPC_CRBITRCRegClassID, 1)) {
		int cr = getBICRCond(MCOperand_getReg(MCInst_getOperand(MI, 1)));
		switch(cr) {
			case CREQ:
				SStream_concat(&ss, opCode, "eq");
				break;
			case CRGT:
				SStream_concat(&ss, opCode, "gt");
				break;
			case CRLT:
				SStream_concat(&ss, opCode, "lt");
				break;
			case CRUN:
				SStream_concat(&ss, opCode, "so");
				break;
		}

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 14)
			SStream_concat0(&ss, "-");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 15)
			SStream_concat0(&ss, "+");

		decCtr = false;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			((MCOperand_getImm(MCInst_getOperand(MI, 0)) & 0x12)== 16)) {
		SStream_concat(&ss, opCode, "dnz");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 24)
			SStream_concat0(&ss, "-");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 25)
			SStream_concat0(&ss, "+");

		needComma = false;
	}

	if (MCInst_getNumOperands(MI) == 3 &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			((MCOperand_getImm(MCInst_getOperand(MI, 0)) & 0x12)== 18)) {
		SStream_concat(&ss, opCode, "dz");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 26)
			SStream_concat0(&ss, "-");

		if (MCOperand_getImm(MCInst_getOperand(MI, 0)) == 27)
			SStream_concat0(&ss, "+");

		needComma = false;
	}

	if (MCOperand_isReg(MCInst_getOperand(MI, 1)) &&
			GETREGCLASS_CONTAIN(PPC_CRBITRCRegClassID, 1) &&
			MCOperand_isImm(MCInst_getOperand(MI, 0)) &&
			(MCOperand_getImm(MCInst_getOperand(MI, 0)) < 16)) {
		int cr = getBICR(MCOperand_getReg(MCInst_getOperand(MI, 1)));

		if (decCtr) {
			needComma = true;
			SStream_concat0(&ss, " ");

			if (cr > PPC_CR0) {
				SStream_concat(&ss, "4*cr%d+", cr - PPC_CR0);
			}

			cr = getBICRCond(MCOperand_getReg(MCInst_getOperand(MI, 1)));
			switch(cr) {
				case CREQ:
					SStream_concat0(&ss, "eq");
					op_addBC(MI, PPC_BC_EQ);
					break;
				case CRGT:
					SStream_concat0(&ss, "gt");
					op_addBC(MI, PPC_BC_GT);
					break;
				case CRLT:
					SStream_concat0(&ss, "lt");
					op_addBC(MI, PPC_BC_LT);
					break;
				case CRUN:
					SStream_concat0(&ss, "so");
					op_addBC(MI, PPC_BC_SO);
					break;
			}

			cr = getBICR(MCOperand_getReg(MCInst_getOperand(MI, 1)));
			if (cr > PPC_CR0) {
				if (MI->csh->detail) {
					MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_CRX;
					MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].crx.scale = 4;
					MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].crx.reg = PPC_REG_CR0 + cr - PPC_CR0;
					MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].crx.cond = MI->flat_insn->detail->ppc.bc;
					MI->flat_insn->detail->ppc.op_count++;
				}
			}
		} else {
			if (cr > PPC_CR0) {
				needComma = true;
				SStream_concat(&ss, " cr%d", cr - PPC_CR0);
				op_addReg(MI, PPC_REG_CR0 + cr - PPC_CR0);
			}
		}
	}

	if (MCOperand_isImm(MCInst_getOperand(MI, 2)) &&
			MCOperand_getImm(MCInst_getOperand(MI, 2)) != 0) {
		if (needComma)
			SStream_concat0(&ss, ",");

		SStream_concat0(&ss, " $\xFF\x03\x01");
	}

	tmp = cs_strdup(ss.buffer);
	AsmMnem = tmp;
	for(AsmOps = tmp; *AsmOps; AsmOps++) {
		if (*AsmOps == ' ' || *AsmOps == '\t') {
			*AsmOps = '\0';
			AsmOps++;
			break;
		}
	}

	SStream_concat0(OS, AsmMnem);
	if (*AsmOps) {
		SStream_concat0(OS, "\t");
		for (c = AsmOps; *c; c++) {
			if (*c == '$') {
				c += 1;
				if (*c == (char)0xff) {
					c += 1;
					OpIdx = *c - 1;
					c += 1;
					PrintMethodIdx = *c - 1;
					printCustomAliasOperand(MI, OpIdx, PrintMethodIdx, OS);
				} else
					printOperand(MI, *c - 1, OS);
			} else {
				SStream_concat(OS, "%c", *c);
			}
		}
	}

	return tmp;
}